

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestCallTest::Run(TestCallTest *this)

{
  char cVar1;
  Results rs;
  Test myTest;
  ostringstream oss;
  TestRegistry r;
  allocator local_1679;
  string local_1678;
  string local_1658;
  RunParams local_1638;
  Test local_1620;
  ostringstream local_15e0 [376];
  TestRegistry local_1468;
  
  testinator::TestRegistry::TestRegistry(&local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1620
            );
  std::__cxx11::string::string((string *)&local_1658,"call_test",(allocator *)&local_1638);
  local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
  local_1678._M_string_length = 0;
  local_1678.field_2._M_local_buf[0] = '\0';
  testinator::Test::Test(&local_1620,&local_1468,&local_1658,&local_1678);
  std::__cxx11::string::~string((string *)&local_1678);
  std::__cxx11::string::~string((string *)&local_1658);
  std::__cxx11::string::string((string *)&local_1658,"call_test",&local_1679);
  local_1638.m_flags = 0;
  local_1638._4_4_ = 0;
  local_1638.m_numPropertyChecks = 100;
  local_1638.m_randomSeed = 0;
  testinator::TestRegistry::RunTest
            ((Results *)&local_1678,&local_1468,&local_1658,&local_1638,
             (Outputter *)local_1620._vptr_Test);
  std::__cxx11::string::~string((string *)&local_1658);
  if (local_1678._M_dataplus._M_p == (pointer)local_1678._M_string_length) {
    cVar1 = '\0';
  }
  else {
    cVar1 = local_1678._M_dataplus._M_p[0x40];
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&local_1678);
  testinator::Test::~Test(&local_1620);
  if ((Outputter *)local_1620._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1620._vptr_Test)[8])(local_1620._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry(&local_1468);
  return (bool)cVar1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    testinator::Test myTest(r, "call_test");
    testinator::Results rs = r.RunTest("call_test", testinator::RunParams(), op.get());
    return !rs.empty() && rs.front().m_success;
  }